

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::Int64Parameter::Int64Parameter(Int64Parameter *this,Int64Parameter *from)

{
  void *pvVar1;
  Int64Set *this_00;
  Int64Set *from_00;
  Int64Range *this_01;
  Int64Range *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Int64Parameter_0076e958;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->defaultvalue_ = from->defaultvalue_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 10) {
    this_01 = mutable_range(this);
    from_01 = range(from);
    Int64Range::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0xb) {
    this_00 = mutable_set(this);
    from_00 = set(from);
    Int64Set::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

Int64Parameter::Int64Parameter(const Int64Parameter& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  defaultvalue_ = from.defaultvalue_;
  clear_has_AllowedValues();
  switch (from.AllowedValues_case()) {
    case kRange: {
      mutable_range()->::CoreML::Specification::Int64Range::MergeFrom(from.range());
      break;
    }
    case kSet: {
      mutable_set()->::CoreML::Specification::Int64Set::MergeFrom(from.set());
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Int64Parameter)
}